

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_plot(nk_context *ctx,nk_chart_type type,float *values,int count,int offset)

{
  long lVar1;
  ulong uVar2;
  float fVar3;
  float min_value;
  float min_value_00;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4f2d,
                  "void nk_plot(struct nk_context *, enum nk_chart_type, const float *, int, int)");
  }
  if (values == (float *)0x0) {
    __assert_fail("values",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4f2e,
                  "void nk_plot(struct nk_context *, enum nk_chart_type, const float *, int, int)");
  }
  if (count == 0) {
    return;
  }
  lVar1 = (long)offset;
  min_value_00 = values[lVar1];
  if (count < 1) {
    nk_chart_begin_colored
              (ctx,type,(ctx->style).chart.color,(ctx->style).chart.selected_color,count,
               min_value_00,min_value_00);
  }
  else {
    uVar2 = 0;
    fVar3 = min_value_00;
    do {
      min_value = values[lVar1 + uVar2];
      if (min_value_00 <= min_value) {
        min_value_00 = min_value;
      }
      if (fVar3 <= min_value) {
        min_value = fVar3;
      }
      uVar2 = uVar2 + 1;
      fVar3 = min_value;
    } while ((uint)count != uVar2);
    nk_chart_begin_colored
              (ctx,type,(ctx->style).chart.color,(ctx->style).chart.selected_color,count,min_value,
               min_value_00);
    if (0 < count) {
      uVar2 = 0;
      do {
        nk_chart_push_slot(ctx,values[lVar1 + uVar2],0);
        uVar2 = uVar2 + 1;
      } while ((uint)count != uVar2);
    }
  }
  nk_chart_end(ctx);
  return;
}

Assistant:

NK_API void
nk_plot(struct nk_context *ctx, enum nk_chart_type type, const float *values,
    int count, int offset)
{
    int i = 0;
    float min_value;
    float max_value;

    NK_ASSERT(ctx);
    NK_ASSERT(values);
    if (!ctx || !values || !count) return;

    min_value = values[offset];
    max_value = values[offset];
    for (i = 0; i < count; ++i) {
        min_value = NK_MIN(values[i + offset], min_value);
        max_value = NK_MAX(values[i + offset], max_value);
    }
    nk_chart_begin(ctx, type, count, min_value, max_value);
    for (i = 0; i < count; ++i)
        nk_chart_push(ctx, values[i + offset]);
    nk_chart_end(ctx);
}